

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m2vd_parser.c
# Opt level: O2

MPP_RET m2vd_parser_control(void *ctx,MpiCmd cmd_type,void *param)

{
  if (((byte)m2vd_debug & 1) != 0) {
    _mpp_log_l(4,"m2vd_parser","%s: line(%d), func(%s)",(char *)0x0,"FUN_I",0x184,
               "m2vd_parser_control");
    if (((byte)m2vd_debug & 1) != 0) {
      _mpp_log_l(4,"m2vd_parser","%s: line(%d), func(%s)",(char *)0x0,"FUN_O",0x188,
                 "m2vd_parser_control");
    }
  }
  return MPP_OK;
}

Assistant:

MPP_RET m2vd_parser_control(void *ctx, MpiCmd cmd_type, void *param)
{
    MPP_RET ret = MPP_OK;
    m2vd_dbg_func("FUN_I");
    (void)ctx;
    (void)cmd_type;
    (void)param;
    m2vd_dbg_func("FUN_O");
    return ret;
}